

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O2

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::prepare
          (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *this)

{
  FuncNode *pFVar1;
  Error EVar2;
  RABlock *pRVar3;
  BaseNode *node;
  
  pFVar1 = this->_pass->_func;
  node = (BaseNode *)0x0;
  this->_funcNode = pFVar1;
  pRVar3 = BaseRAPass::newBlockOrExistingAt(this->_pass,pFVar1->_exitNode,&node);
  this->_retBlock = pRVar3;
  EVar2 = 1;
  if (pRVar3 != (RABlock *)0x0) {
    pRVar3[0xc] = (RABlock)((byte)pRVar3[0xc] | 4);
    EVar2 = BaseRAPass::addExitBlock(this->_pass,pRVar3);
    if (EVar2 == 0) {
      if ((FuncNode *)node == pFVar1) {
        pRVar3 = this->_retBlock;
        this->_curBlock = pRVar3;
      }
      else {
        pRVar3 = BaseRAPass::newBlock(this->_pass,(BaseNode *)0x0);
        this->_curBlock = pRVar3;
        if (pRVar3 == (RABlock *)0x0) {
          return 1;
        }
      }
      (this->_blockRegStats)._packed = 0;
      this->_exitLabelId = *(uint32_t *)(pFVar1->_exitNode + 0x30);
      this->_hasCode = false;
      EVar2 = BaseRAPass::addBlock(this->_pass,pRVar3);
    }
  }
  return EVar2;
}

Assistant:

Error prepare() noexcept {
    FuncNode* func = _pass->func();
    BaseNode* node = nullptr;

    // Create entry and exit blocks.
    _funcNode = func;
    _retBlock = _pass->newBlockOrExistingAt(func->exitNode(), &node);

    if (ASMJIT_UNLIKELY(!_retBlock))
      return DebugUtils::errored(kErrorOutOfMemory);

    _retBlock->makeTargetable();
    ASMJIT_PROPAGATE(_pass->addExitBlock(_retBlock));

    if (node != func) {
      _curBlock = _pass->newBlock();
      if (ASMJIT_UNLIKELY(!_curBlock))
        return DebugUtils::errored(kErrorOutOfMemory);
    }
    else {
      // Function that has no code at all.
      _curBlock = _retBlock;
    }

    // Reset everything we may need.
    _blockRegStats.reset();
    _exitLabelId = func->exitNode()->labelId();

    // Initially we assume there is no code in the function body.
    _hasCode = false;

    return _pass->addBlock(_curBlock);
  }